

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QByteArray>::pop_front(QList<QByteArray> *this)

{
  removeFirst(this);
  return;
}

Assistant:

void pop_front() noexcept { removeFirst(); }